

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osrestad.c
# Opt level: O1

int os_get_str_rsc(int id,char *buf,size_t buflen)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  
  iVar1 = 1;
  if ((uint)id < 6) {
    __s = (&prssigreq::toklist[10].toknam)[id];
    sVar2 = strlen(__s);
    iVar1 = 2;
    if (sVar2 + 1 <= buflen) {
      strcpy(buf,__s);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int os_get_str_rsc(int id, char *buf, size_t buflen)
{
    /* 
     *   make sure the index is in range of our array - note that the
     *   index values start at 1, but our array starts at 0, so adjust
     *   accordingly 
     */
	if (id < 0 || (size_t)id >= sizeof(S_res_strings)/sizeof(S_res_strings[0]))
        return 1;

    /* make sure the buffer is large enough */
    if (buflen < strlen(S_res_strings[id-1]) + 1)
        return 2;

    /* copy the string */
    strcpy(buf, S_res_strings[id-1]);

    /* return success */
    return 0;
}